

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderTessellationMaxInOut::initProgramObjects
          (TessellationShaderTessellationMaxInOut *this)

{
  undefined8 __src;
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  char **ppcVar6;
  ResourceError *pRVar7;
  ostream *poVar8;
  size_t sVar9;
  char *pcVar10;
  TestError *pTVar11;
  char *local_2d0;
  char *tf_varying_2;
  char *tes_code_2_raw_ptr;
  char *tcs_code_2_raw_ptr;
  char *tes_code_1_raw_ptr;
  char *tcs_code_1_raw_ptr;
  char *vs_code_raw_ptr;
  string local_298;
  undefined1 local_272;
  allocator<char> local_271;
  string local_270;
  string local_250 [32];
  string local_230 [8];
  string tf_varying_string;
  char *tf_varying_raw_ptr;
  stringstream tf_varying_stream;
  ostream local_1f8;
  int local_7c;
  undefined1 local_75;
  int i;
  allocator<char> local_61;
  string local_60;
  char local_3c [8];
  char position_varying [12];
  Functions *gl;
  TessellationShaderTessellationMaxInOut *this_local;
  
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  position_varying._4_8_ = CONCAT44(extraout_var,iVar2);
  GVar3 = (**(code **)(position_varying._4_8_ + 0x3c8))();
  this->m_po_id_1 = GVar3;
  dVar4 = (**(code **)(position_varying._4_8_ + 0x800))();
  glu::checkError(dVar4,"glCreateProgram() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x9c4);
  GVar3 = (**(code **)(position_varying._4_8_ + 0x3c8))();
  this->m_po_id_2 = GVar3;
  dVar4 = (**(code **)(position_varying._4_8_ + 0x800))();
  glu::checkError(dVar4,"glCreateProgram() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x9c7);
  GVar3 = (**(code **)(position_varying._4_8_ + 0x3f0))(0x8b31);
  this->m_vs_id_1 = GVar3;
  dVar4 = (**(code **)(position_varying._4_8_ + 0x800))();
  glu::checkError(dVar4,"glCreateShader(GL_VERTEX_SHADER) failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x9cb);
  GVar3 = (**(code **)(position_varying._4_8_ + 0x3f0))(0x8b31);
  this->m_vs_id_2 = GVar3;
  dVar4 = (**(code **)(position_varying._4_8_ + 0x800))();
  glu::checkError(dVar4,"glCreateShader(GL_VERTEX_SHADER) failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x9ce);
  GVar3 = (**(code **)(position_varying._4_8_ + 0x3f0))
                    ((this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER);
  this->m_tcs_id_1 = GVar3;
  dVar4 = (**(code **)(position_varying._4_8_ + 0x800))();
  glu::checkError(dVar4,"glCreateShader(GL_TESS_CONTROL_SHADER_EXT) failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x9d1);
  GVar3 = (**(code **)(position_varying._4_8_ + 0x3f0))
                    ((this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER);
  this->m_tcs_id_2 = GVar3;
  dVar4 = (**(code **)(position_varying._4_8_ + 0x800))();
  glu::checkError(dVar4,"glCreateShader(GL_TESS_CONTROL_SHADER_EXT) failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x9d4);
  GVar3 = (**(code **)(position_varying._4_8_ + 0x3f0))
                    ((this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER);
  this->m_tes_id_1 = GVar3;
  dVar4 = (**(code **)(position_varying._4_8_ + 0x800))();
  glu::checkError(dVar4,"glCreateShader(GL_TESS_EVALUATION_SHADER_EXT) failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x9d7);
  GVar3 = (**(code **)(position_varying._4_8_ + 0x3f0))
                    ((this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER);
  this->m_tes_id_2 = GVar3;
  dVar4 = (**(code **)(position_varying._4_8_ + 0x800))();
  glu::checkError(dVar4,"glCreateShader(GL_TESS_EVALUATION_SHADER_EXT) failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x9da);
  GVar3 = (**(code **)(position_varying._4_8_ + 0x3f0))(0x8b30);
  this->m_fs_id = GVar3;
  dVar4 = (**(code **)(position_varying._4_8_ + 0x800))();
  glu::checkError(dVar4,"glCreateShader(GL_FRAGMENT_SHADER) failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x9dd);
  builtin_strncpy(local_3c,"gl_Posit",8);
  builtin_strncpy(position_varying,"ion",4);
  ppcVar6 = (char **)malloc((long)(this->m_gl_max_tess_evaluation_output_components_value / 4) << 3)
  ;
  this->m_tf_varyings_names = ppcVar6;
  if (this->m_tf_varyings_names == (char **)0x0) {
    local_75 = 1;
    pRVar7 = (ResourceError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"Unable to allocate memory!",&local_61);
    tcu::ResourceError::ResourceError(pRVar7,&local_60);
    local_75 = 0;
    __cxa_throw(pRVar7,&tcu::ResourceError::typeinfo,tcu::ResourceError::~ResourceError);
  }
  for (local_7c = 0; local_7c < this->m_gl_max_tess_evaluation_output_components_value / 4 + -1;
      local_7c = local_7c + 1) {
    std::__cxx11::stringstream::stringstream((stringstream *)&tf_varying_raw_ptr);
    tf_varying_string.field_2._8_8_ = 0;
    std::__cxx11::string::string(local_230);
    poVar8 = std::operator<<(&local_1f8,"Vertex.value[");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_7c);
    std::operator<<(poVar8,"]");
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=(local_230,local_250);
    std::__cxx11::string::~string(local_250);
    tf_varying_string.field_2._8_8_ = std::__cxx11::string::c_str();
    sVar9 = strlen((char *)tf_varying_string.field_2._8_8_);
    pcVar10 = (char *)malloc(sVar9 + 1);
    __src = tf_varying_string.field_2._8_8_;
    this->m_tf_varyings_names[local_7c] = pcVar10;
    if (this->m_tf_varyings_names[local_7c] == (char *)0x0) {
      local_272 = 1;
      pRVar7 = (ResourceError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_270,"Unable to allocate memory!",&local_271);
      tcu::ResourceError::ResourceError(pRVar7,&local_270);
      local_272 = 0;
      __cxa_throw(pRVar7,&tcu::ResourceError::typeinfo,tcu::ResourceError::~ResourceError);
    }
    pcVar10 = this->m_tf_varyings_names[local_7c];
    sVar9 = strlen((char *)tf_varying_string.field_2._8_8_);
    memcpy(pcVar10,(void *)__src,sVar9 + 1);
    std::__cxx11::string::~string(local_230);
    std::__cxx11::stringstream::~stringstream((stringstream *)&tf_varying_raw_ptr);
  }
  pcVar10 = (char *)malloc(0xc);
  this->m_tf_varyings_names[this->m_gl_max_tess_evaluation_output_components_value / 4 + -1] =
       pcVar10;
  if (this->m_tf_varyings_names[this->m_gl_max_tess_evaluation_output_components_value / 4 + -1] ==
      (char *)0x0) {
    vs_code_raw_ptr._6_1_ = 1;
    pRVar7 = (ResourceError *)
             __cxa_allocate_exception
                       (0x38,pcVar10,
                        (long)this->m_gl_max_tess_evaluation_output_components_value % 4 &
                        0xffffffff);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_298,"Unable to allocate memory!",
               (allocator<char> *)((long)&vs_code_raw_ptr + 7));
    tcu::ResourceError::ResourceError(pRVar7,&local_298);
    vs_code_raw_ptr._6_1_ = 0;
    __cxa_throw(pRVar7,&tcu::ResourceError::typeinfo,tcu::ResourceError::~ResourceError);
  }
  pcVar10 = this->m_tf_varyings_names
            [this->m_gl_max_tess_evaluation_output_components_value / 4 + -1];
  *(char (*) [8])pcVar10 = local_3c;
  *(undefined4 *)(pcVar10 + 8) = position_varying._0_4_;
  (**(code **)(position_varying._4_8_ + 0x14c8))
            (this->m_po_id_1,
             (long)this->m_gl_max_tess_evaluation_output_components_value / 4 & 0xffffffff,
             this->m_tf_varyings_names,0x8c8c);
  dVar4 = (**(code **)(position_varying._4_8_ + 0x800))();
  glu::checkError(dVar4,"glTransformFeedbackVaryings() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0xa0e);
  tcs_code_1_raw_ptr = m_vs_code;
  tes_code_1_raw_ptr = m_tcs_code_1;
  tcs_code_2_raw_ptr = m_tes_code_1;
  tes_code_2_raw_ptr = m_tcs_code_2;
  tf_varying_2 = m_tes_code_2;
  bVar1 = TestCaseBase::buildProgram
                    (&this->super_TestCaseBase,this->m_po_id_1,this->m_vs_id_1,1,&tcs_code_1_raw_ptr
                     ,this->m_tcs_id_1,1,&tes_code_1_raw_ptr,this->m_tes_id_1,1,&tcs_code_2_raw_ptr,
                     this->m_fs_id,1,&m_fs_code,(bool *)0x0);
  if (!bVar1) {
    pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar11,"Could not build first test program object",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
               ,0xa1c);
    __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  local_2d0 = "out_value";
  (**(code **)(position_varying._4_8_ + 0x14c8))(this->m_po_id_2,1,&local_2d0,0x8c8c);
  dVar4 = (**(code **)(position_varying._4_8_ + 0x800))();
  glu::checkError(dVar4,"glTransformFeedbackVaryings() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0xa23);
  bVar1 = TestCaseBase::buildProgram
                    (&this->super_TestCaseBase,this->m_po_id_2,this->m_vs_id_2,1,&tcs_code_1_raw_ptr
                     ,this->m_tcs_id_2,1,&tes_code_2_raw_ptr,this->m_tes_id_2,1,&tf_varying_2,
                     this->m_fs_id,1,&m_fs_code,(bool *)0x0);
  if (!bVar1) {
    pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar11,"Could not link second test program object",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
               ,0xa2a);
    __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return;
}

Assistant:

void TessellationShaderTessellationMaxInOut::initProgramObjects(void)
{
	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create program objects. */
	m_po_id_1 = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() failed!");

	m_po_id_2 = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() failed!");

	/* Set up all the shader objects that will be used for the test */
	m_vs_id_1 = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader(GL_VERTEX_SHADER) failed!");

	m_vs_id_2 = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader(GL_VERTEX_SHADER) failed!");

	m_tcs_id_1 = gl.createShader(m_glExtTokens.TESS_CONTROL_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader(GL_TESS_CONTROL_SHADER_EXT) failed!");

	m_tcs_id_2 = gl.createShader(m_glExtTokens.TESS_CONTROL_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader(GL_TESS_CONTROL_SHADER_EXT) failed!");

	m_tes_id_1 = gl.createShader(m_glExtTokens.TESS_EVALUATION_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader(GL_TESS_EVALUATION_SHADER_EXT) failed!");

	m_tes_id_2 = gl.createShader(m_glExtTokens.TESS_EVALUATION_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader(GL_TESS_EVALUATION_SHADER_EXT) failed!");

	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader(GL_FRAGMENT_SHADER) failed!");

	/* Transform Feedback setup for case 1
	 *
	 * Varyings array: m_tf_varyings_names[i <  m_gl_max_tess_evaluation_output_components_value / 4-1] == "Vertex.value[i]"
	 *                 m_tf_varyings_names[i == m_gl_max_tess_evaluation_output_components_value / 4-1] == "gl_Position"
	 */
	const char position_varying[] = "gl_Position";

	m_tf_varyings_names = (char**)malloc((m_gl_max_tess_evaluation_output_components_value / 4) * sizeof(char*));

	if (m_tf_varyings_names == DE_NULL)
	{
		throw tcu::ResourceError("Unable to allocate memory!");
	}

	for (int i = 0; i < (m_gl_max_tess_evaluation_output_components_value) / 4 /* attributes */ - 1 /* gl_Position */;
		 i++)
	{
		std::stringstream tf_varying_stream;
		const char*		  tf_varying_raw_ptr = DE_NULL;
		std::string		  tf_varying_string;

		tf_varying_stream << "Vertex.value[" << i << "]";
		tf_varying_string  = tf_varying_stream.str();
		tf_varying_raw_ptr = tf_varying_string.c_str();

		m_tf_varyings_names[i] = (char*)malloc(strlen(tf_varying_raw_ptr) + 1 /* '\0' */);
		if (m_tf_varyings_names[i] == DE_NULL)
		{
			throw tcu::ResourceError("Unable to allocate memory!");
		}

		memcpy(m_tf_varyings_names[i], tf_varying_raw_ptr, strlen(tf_varying_raw_ptr) + 1);
	}

	m_tf_varyings_names[m_gl_max_tess_evaluation_output_components_value / 4 - 1 /* gl_Position */] =
		(char*)malloc(sizeof(position_varying));
	if (m_tf_varyings_names[m_gl_max_tess_evaluation_output_components_value / 4 - 1 /* gl_Position */] == DE_NULL)
	{
		throw tcu::ResourceError("Unable to allocate memory!");
	}

	memcpy(m_tf_varyings_names[m_gl_max_tess_evaluation_output_components_value / 4 - 1 /* gl_Position */],
		   position_varying, sizeof(position_varying));

	/* Set up XFB */
	gl.transformFeedbackVaryings(m_po_id_1, m_gl_max_tess_evaluation_output_components_value / 4, m_tf_varyings_names,
								 GL_INTERLEAVED_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() failed!");

	/* Set up program objects */
	const char* vs_code_raw_ptr	= m_vs_code;
	const char* tcs_code_1_raw_ptr = m_tcs_code_1;
	const char* tes_code_1_raw_ptr = m_tes_code_1;
	const char* tcs_code_2_raw_ptr = m_tcs_code_2;
	const char* tes_code_2_raw_ptr = m_tes_code_2;

	/* Build a program object to test case 1. */
	if (!TessellationShaderTessellationMaxInOut::buildProgram(m_po_id_1, m_vs_id_1, 1, &vs_code_raw_ptr, m_tcs_id_1, 1,
															  &tcs_code_1_raw_ptr, m_tes_id_1, 1, &tes_code_1_raw_ptr,
															  m_fs_id, 1, &m_fs_code))
	{
		TCU_FAIL("Could not build first test program object");
	}

	/* Tranform Feedback setup for case 2 */
	const char* const tf_varying_2 = "out_value";

	gl.transformFeedbackVaryings(m_po_id_2, 1 /* count */, &tf_varying_2, GL_INTERLEAVED_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() failed!");

	/* Build a program object for case 2 */
	if (!(TessellationShaderTessellationMaxInOut::buildProgram(m_po_id_2, m_vs_id_2, 1, &vs_code_raw_ptr, m_tcs_id_2, 1,
															   &tcs_code_2_raw_ptr, m_tes_id_2, 1, &tes_code_2_raw_ptr,
															   m_fs_id, 1, &m_fs_code)))
	{
		TCU_FAIL("Could not link second test program object");
	}
}